

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool wasEscaped(iterator First,iterator Position)

{
  long lVar1;
  iterator pcVar2;
  
  pcVar2 = Position + -1;
  if (First <= pcVar2) {
    for (lVar1 = 0; (First <= pcVar2 + lVar1 && (pcVar2[lVar1] == '\\')); lVar1 = lVar1 + -1) {
    }
    return (-lVar1 & 0x8000000000000001U) == 1;
  }
  __assert_fail("Position - 1 >= First",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/YAMLParser.cpp"
                ,0x4b6,"bool wasEscaped(StringRef::iterator, StringRef::iterator)");
}

Assistant:

static bool wasEscaped(StringRef::iterator First,
                       StringRef::iterator Position) {
  assert(Position - 1 >= First);
  StringRef::iterator I = Position - 1;
  // We calculate the number of consecutive '\'s before the current position
  // by iterating backwards through our string.
  while (I >= First && *I == '\\') --I;
  // (Position - 1 - I) now contains the number of '\'s before the current
  // position. If it is odd, the character at 'Position' was escaped.
  return (Position - 1 - I) % 2 == 1;
}